

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcDebugAddBreakpointImpl(uint instruction,bool oneHit)

{
  bool bVar1;
  
  if (NULLC::currExec == 1) {
    if (NULLC::executorX86 == (ExecutorX86 *)0x0) goto LAB_0010daf3;
    bVar1 = ExecutorX86::AddBreakpoint(NULLC::executorX86,instruction,oneHit);
    if (!bVar1) {
      NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
      return '\0';
    }
  }
  if (NULLC::currExec != 0) {
    return '\x01';
  }
  if (NULLC::executorRegVm != (ExecutorRegVm *)0x0) {
    bVar1 = ExecutorRegVm::AddBreakpoint(NULLC::executorRegVm,instruction,oneHit);
    if (!bVar1) {
      NULLC::nullcLastError = ExecutorRegVm::GetErrorMessage(NULLC::executorRegVm);
      return '\0';
    }
    return '\x01';
  }
LAB_0010daf3:
  NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  return '\0';
}

Assistant:

nullres nullcDebugAddBreakpointImpl(unsigned int instruction, bool oneHit)
{
	using namespace NULLC;

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
	{
		if(!executorX86)
		{
			nullcLastError = "ERROR: NULLC is not initialized";
			return false;
		}
		if(!executorX86->AddBreakpoint(instruction, oneHit))
		{
			nullcLastError = executorX86->GetErrorMessage();
			return false;
		}
	}
#endif

	if(currExec == NULLC_REG_VM)
	{
		if(!executorRegVm)
		{
			nullcLastError = "ERROR: NULLC is not initialized";
			return false;
		}

		if(!executorRegVm->AddBreakpoint(instruction, oneHit))
		{
			nullcLastError = executorRegVm->GetErrorMessage();
			return false;
		}
	}

	return true;
}